

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  char *pcVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar2;
  double dVar3;
  int opcode;
  LogicalConstant LVar4;
  LogicalExpr LVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  local_20.field_1.values_ = (Value *)&local_38;
  this_00 = this->reader_;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  switch(*pcVar1) {
  case 'l':
  case 'n':
  case 's':
    pNVar2 = this->handler_;
    dVar3 = ReadConstant(this,*pcVar1);
    LVar4 = BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                      (&pNVar2->builder_->super_ExprFactory,(bool)(-(dVar3 != 0.0) & 1));
    return (LogicalExpr)
           LVar4.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
  default:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)0x1725ba,&local_20);
    return (LogicalExpr)(Impl *)0x0;
  case 'o':
    opcode = ReadOpCode(this);
    LVar5 = ReadLogicalExpr(this,opcode);
    return (LogicalExpr)LVar5.super_ExprBase.impl_;
  }
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}